

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetGlobalForceVectorAtSample
          (VClient *this,uint i_PlateID,uint i_Subsample,double (*o_rForceVector) [3])

{
  pointer pVVar1;
  bool bVar2;
  Enum EVar3;
  ulong uVar4;
  Enum EVar5;
  long lVar6;
  uint PlateIndex;
  scoped_lock Lock;
  array<double,_3UL> ForceVector;
  array<double,_3UL> WorldForceVector;
  array<double,_9UL> WorldRotation;
  uint local_cc;
  unique_lock<boost::recursive_mutex> local_c8;
  array<double,_3UL> local_b8;
  array<double,_3UL> local_a0;
  double local_88;
  double dStack_80;
  double local_78;
  array<double,_9UL> local_70;
  
  local_c8.m = &this->m_FrameMutex;
  local_c8.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_c8);
  lVar6 = 0;
  do {
    ClientUtils::Clear((double *)((long)*o_rForceVector + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x18);
  EVar3 = GetForcePlateVector<ViconCGStream::VForceFrame>
                    (this,i_PlateID,i_Subsample,&(this->m_LatestFrame).m_Forces,&local_a0);
  if (EVar3 == Success) {
    bVar2 = ForcePlateDeviceIndex(this,i_PlateID,&local_cc);
    if (!bVar2) {
      EVar5 = Unknown;
      goto LAB_0012c83e;
    }
    pVVar1 = (this->m_LatestFrame).m_ForcePlates.
             super__Vector_base<ViconCGStream::VForcePlateInfo,_std::allocator<ViconCGStream::VForcePlateInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 10;
    lVar6 = 0;
    do {
      *(double *)((long)local_70._M_elems + lVar6 * 2) =
           (double)*(float *)((long)pVVar1[local_cc].m_WorldRotation + lVar6);
      uVar4 = uVar4 - 1;
      lVar6 = lVar6 + 4;
    } while (1 < uVar4);
    ClientUtils::operator*(&local_b8,&local_70,&local_a0);
    local_78 = local_b8._M_elems[2];
    local_88 = local_b8._M_elems[0];
    dStack_80 = local_b8._M_elems[1];
    CopyAndTransformT(this,&local_88,o_rForceVector);
    EVar5 = Unknown;
    if (!bVar2) goto LAB_0012c83e;
  }
  EVar5 = EVar3;
LAB_0012c83e:
  if (local_c8.is_locked == true) {
    boost::recursive_mutex::unlock(local_c8.m);
  }
  return EVar5;
}

Assistant:

Result::Enum VClient::GetGlobalForceVectorAtSample( const unsigned int i_PlateID,
                                            const unsigned int i_Subsample, 
                                            double ( & o_rForceVector)[3] ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Clear( o_rForceVector );

  std::array< double, 3 > ForceVector;

  Result::Enum Result = GetForceVector( i_PlateID, i_Subsample, ForceVector );

  if( Result == Result::Success )
  {
    // Get the plate index.

    unsigned int PlateIndex;
    if( !ForcePlateDeviceIndex( i_PlateID, PlateIndex ) )
    {
      return Result::Unknown;
    }

    // Transform result to global coordinates by rotating by plate orientation.

    const ViconCGStream::VForcePlateInfo & rForcePlate = m_LatestFrame.m_ForcePlates[ PlateIndex ];

    std::array< double, 3 * 3 > WorldRotation;
    std::copy( rForcePlate.m_WorldRotation, rForcePlate.m_WorldRotation + 9, WorldRotation.begin() );

    std::array< double, 3 > WorldForceVector;

    WorldForceVector = WorldRotation * ForceVector;

    CopyAndTransformT( WorldForceVector.data(), o_rForceVector );
  }

  return Result;
}